

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jit_compiler_x86.cpp
# Opt level: O3

void __thiscall
randomx::JitCompilerX86::generateProgramLight
          (JitCompilerX86 *this,Program *prog,ProgramConfiguration *pcfg,uint32_t datasetOffset)

{
  uint8_t *puVar1;
  int iVar2;
  int iVar3;
  Program *prog_00;
  
  generateProgramPrologue(this,prog,pcfg);
  iVar2 = readDatasetLightInitSize;
  memcpy(this->code + this->codePos,codeReadDatasetLightSshInit,(long)readDatasetLightInitSize);
  iVar2 = this->codePos + iVar2;
  this->codePos = iVar2;
  puVar1 = this->code;
  (puVar1 + iVar2)[0] = 0x81;
  (puVar1 + iVar2)[1] = 0xc3;
  iVar2 = this->codePos + 2;
  this->codePos = iVar2;
  *(uint32_t *)(this->code + iVar2) = datasetOffset >> 6;
  iVar2 = this->codePos + 4;
  this->codePos = iVar2;
  this->code[iVar2] = 0xe8;
  iVar2 = this->codePos;
  this->codePos = iVar2 + 1;
  *(int *)(this->code + (long)iVar2 + 1) = 0x2ffb - iVar2;
  iVar3 = this->codePos + 4;
  this->codePos = iVar3;
  iVar2 = readDatasetLightFinSize;
  prog_00 = codeReadDatasetLightSshFin;
  memcpy(this->code + iVar3,codeReadDatasetLightSshFin,(long)readDatasetLightFinSize);
  this->codePos = this->codePos + iVar2;
  generateProgramEpilogue(this,prog_00,pcfg);
  return;
}

Assistant:

void JitCompilerX86::generateProgramLight(Program& prog, ProgramConfiguration& pcfg, uint32_t datasetOffset) {
		generateProgramPrologue(prog, pcfg);
		emit(codeReadDatasetLightSshInit, readDatasetLightInitSize);
		emit(ADD_EBX_I);
		emit32(datasetOffset / CacheLineSize);
		emitByte(CALL);
		emit32(superScalarHashOffset - (codePos + 4));
		emit(codeReadDatasetLightSshFin, readDatasetLightFinSize);
		generateProgramEpilogue(prog, pcfg);
	}